

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void getCompatibleInterfaceProperties
               (cmGeneratorTarget *target,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *ifaceProperties,string *config)

{
  pointer pcVar1;
  pointer pIVar2;
  cmGeneratorTarget *pcVar3;
  TargetType TVar4;
  cmComputeLinkInformation *this;
  ItemVector *pIVar5;
  cmLocalGenerator *this_00;
  string *psVar6;
  ostream *poVar7;
  pointer pIVar8;
  ostringstream e;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  TVar4 = cmGeneratorTarget::GetType(target);
  if (TVar4 != OBJECT_LIBRARY) {
    this = cmGeneratorTarget::GetLinkInformation(target,config);
    if (this == (cmComputeLinkInformation *)0x0) {
      this_00 = cmGeneratorTarget::GetLocalGenerator(target);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Exporting the target \"",0x16);
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\" is not allowed since its linker language cannot be determined",0x3f);
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    else {
      pIVar5 = cmComputeLinkInformation::GetItems(this);
      pIVar8 = (pIVar5->
               super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pIVar2 = (pIVar5->
               super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar8 != pIVar2) {
        pcVar1 = local_1a8 + 0x10;
        do {
          pcVar3 = pIVar8->Target;
          if (pcVar3 != (cmGeneratorTarget *)0x0) {
            local_1a8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"COMPATIBLE_INTERFACE_BOOL","");
            getPropertyContents(pcVar3,(string *)local_1a8,ifaceProperties);
            if ((pointer)local_1a8._0_8_ != pcVar1) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            pcVar3 = pIVar8->Target;
            local_1a8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"COMPATIBLE_INTERFACE_STRING","");
            getPropertyContents(pcVar3,(string *)local_1a8,ifaceProperties);
            if ((pointer)local_1a8._0_8_ != pcVar1) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            pcVar3 = pIVar8->Target;
            local_1a8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"COMPATIBLE_INTERFACE_NUMBER_MIN","");
            getPropertyContents(pcVar3,(string *)local_1a8,ifaceProperties);
            if ((pointer)local_1a8._0_8_ != pcVar1) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            pcVar3 = pIVar8->Target;
            local_1a8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"COMPATIBLE_INTERFACE_NUMBER_MAX","");
            getPropertyContents(pcVar3,(string *)local_1a8,ifaceProperties);
            if ((pointer)local_1a8._0_8_ != pcVar1) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
          }
          pIVar8 = pIVar8 + 1;
        } while (pIVar8 != pIVar2);
      }
    }
  }
  return;
}

Assistant:

void getCompatibleInterfaceProperties(cmGeneratorTarget* target,
                                      std::set<std::string>& ifaceProperties,
                                      const std::string& config)
{
  if (target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    // object libraries have no link information, so nothing to compute
    return;
  }

  cmComputeLinkInformation* info = target->GetLinkInformation(config);

  if (!info) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Exporting the target \"" << target->GetName()
      << "\" is not "
         "allowed since its linker language cannot be determined";
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  const cmComputeLinkInformation::ItemVector& deps = info->GetItems();

  for (auto const& dep : deps) {
    if (!dep.Target) {
      continue;
    }
    getPropertyContents(dep.Target, "COMPATIBLE_INTERFACE_BOOL",
                        ifaceProperties);
    getPropertyContents(dep.Target, "COMPATIBLE_INTERFACE_STRING",
                        ifaceProperties);
    getPropertyContents(dep.Target, "COMPATIBLE_INTERFACE_NUMBER_MIN",
                        ifaceProperties);
    getPropertyContents(dep.Target, "COMPATIBLE_INTERFACE_NUMBER_MAX",
                        ifaceProperties);
  }
}